

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O1

size_t BuildAndStoreLiteralPrefixCode
                 (MemoryManager *m,uint8_t *input,size_t input_size,uint8_t *depths,uint16_t *bits,
                 size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint32_t histogram [256];
  
  memset(histogram,0,0x400);
  if (input_size < 0x8000) {
    if (input_size != 0) {
      sVar2 = 0;
      do {
        histogram[input[sVar2]] = histogram[input[sVar2]] + 1;
        sVar2 = sVar2 + 1;
      } while (input_size != sVar2);
    }
    lVar3 = 0;
    do {
      uVar1 = histogram[lVar3];
      uVar6 = 0xb;
      if (uVar1 < 0xb) {
        uVar6 = uVar1;
      }
      histogram[lVar3] = uVar1 + uVar6 * 2;
      input_size = input_size + uVar6 * 2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  else {
    uVar4 = 0;
    do {
      histogram[input[uVar4]] = histogram[input[uVar4]] + 1;
      uVar4 = uVar4 + 0x1d;
    } while (uVar4 < input_size);
    input_size = (input_size + 0x1c) / 0x1d;
    lVar3 = 0;
    do {
      uVar1 = histogram[lVar3];
      uVar6 = 0xb;
      if (uVar1 < 0xb) {
        uVar6 = uVar1;
      }
      histogram[lVar3] = uVar1 + uVar6 * 2 + 1;
      input_size = input_size + (uVar6 * 2 + 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  BrotliBuildAndStoreHuffmanTreeFast(m,histogram,input_size,8,depths,bits,storage_ix,storage);
  lVar3 = 0;
  lVar5 = 0;
  do {
    if (histogram[lVar5] != 0) {
      lVar3 = lVar3 + (ulong)(histogram[lVar5] * (uint)depths[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return (ulong)(lVar3 * 0x7d) / input_size;
}

Assistant:

static size_t BuildAndStoreLiteralPrefixCode(MemoryManager* m,
                                             const uint8_t* input,
                                             const size_t input_size,
                                             uint8_t depths[256],
                                             uint16_t bits[256],
                                             size_t* storage_ix,
                                             uint8_t* storage) {
  uint32_t histogram[256] = { 0 };
  size_t histogram_total;
  size_t i;
  if (input_size < (1 << 15)) {
    for (i = 0; i < input_size; ++i) {
      ++histogram[input[i]];
    }
    histogram_total = input_size;
    for (i = 0; i < 256; ++i) {
      /* We weigh the first 11 samples with weight 3 to account for the
         balancing effect of the LZ77 phase on the histogram. */
      const uint32_t adjust = 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  } else {
    static const size_t kSampleRate = 29;
    for (i = 0; i < input_size; i += kSampleRate) {
      ++histogram[input[i]];
    }
    histogram_total = (input_size + kSampleRate - 1) / kSampleRate;
    for (i = 0; i < 256; ++i) {
      /* We add 1 to each population count to avoid 0 bit depths (since this is
         only a sample and we don't know if the symbol appears or not), and we
         weigh the first 11 samples with weight 3 to account for the balancing
         effect of the LZ77 phase on the histogram (more frequent symbols are
         more likely to be in backward references instead as literals). */
      const uint32_t adjust = 1 + 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, histogram, histogram_total,
                                     /* max_bits = */ 8,
                                     depths, bits, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return 0;
  {
    size_t literal_ratio = 0;
    for (i = 0; i < 256; ++i) {
      if (histogram[i]) literal_ratio += histogram[i] * depths[i];
    }
    /* Estimated encoding ratio, millibytes per symbol. */
    return (literal_ratio * 125) / histogram_total;
  }
}